

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_GIF_Image.cxx
# Opt level: O0

void __thiscall Fl_GIF_Image::Fl_GIF_Image(Fl_GIF_Image *this,char *infname)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  bool bVar3;
  undefined1 uVar4;
  uchar uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  FILE *__stream;
  size_t sVar15;
  uchar *puVar16;
  ulong uVar17;
  char **p_00;
  char *pcVar18;
  uchar **ppuVar19;
  uchar *puVar20;
  byte *pbVar21;
  int local_39f4;
  int length;
  int numcolors;
  int base;
  int i;
  uchar remap [256];
  uchar used [256];
  uchar t;
  uchar **ppuStack_37e0;
  int i_4;
  uchar *tp;
  uchar OutCode [1025];
  uint local_33c8;
  int local_33c4;
  int CurCode;
  int frombit;
  uchar local_33b8 [3];
  uchar thisbyte;
  int blocklen;
  uchar Suffix [4096];
  short Prefix [4096];
  int OldCode;
  int FreeCode;
  int ReadMask;
  int FinChar;
  int FirstFree;
  int EOFCode;
  int ClearCode;
  int InitCodeSize;
  uchar *eol;
  uchar *p;
  int Pass;
  int YC;
  uchar *Image;
  int n;
  int iStack_36c;
  char bits;
  int blocklen_1;
  int i_3;
  int iStack_360;
  char Interlace;
  int CodeSize;
  int i_2;
  int i_1;
  uchar Blue [256];
  uchar Green [256];
  uchar Red [256];
  int local_50;
  sbyte sStack_4c;
  char has_transparent;
  uchar transparent_pixel;
  int ColorMapSize;
  int BitsPerPixel;
  char HasColormap;
  uchar ch;
  int Height;
  int Width;
  char b [6];
  char **new_data;
  FILE *GifFile;
  char *infname_local;
  Fl_GIF_Image *this_local;
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_GIF_Image_002efaa8;
  __stream = (FILE *)fl_fopen(infname,"rb");
  if (__stream == (FILE *)0x0) {
    (*Fl::error)("Fl_GIF_Image: Unable to open %s!",infname);
    Fl_Image::ld((Fl_Image *)this,-2);
  }
  else {
    sVar15 = fread((void *)((long)&Height + 2),1,6,__stream);
    if (sVar15 < 6) {
      fclose(__stream);
      Fl_Image::ld((Fl_Image *)this,-2);
    }
    else {
      if (((Height._2_1_ == 'G') && (Height._3_1_ == 'I')) && ((char)Width == 'F')) {
        if (((Width._1_1_ != '8') || ('9' < Width._2_1_)) || (Width._3_1_ != 'a')) {
          (*Fl::warning)("%s is version %c%c%c.",infname,(ulong)(uint)(int)Width._1_1_,
                         (ulong)(uint)(int)Width._2_1_,(ulong)(uint)(int)Width._3_1_);
        }
        getc(__stream);
        getc(__stream);
        getc(__stream);
        getc(__stream);
        uVar7 = getc(__stream);
        uVar8 = (uVar7 & 7) + 1;
        sStack_4c = (sbyte)uVar8;
        local_50 = 1 << sStack_4c;
        getc(__stream);
        getc(__stream);
        Red[0xff] = '\0';
        bVar3 = false;
        if ((char)uVar7 < '\0') {
          for (CodeSize = 0; CodeSize < local_50; CodeSize = CodeSize + 1) {
            iVar9 = getc(__stream);
            Green[(long)CodeSize + 0xf8] = (uchar)iVar9;
            iVar9 = getc(__stream);
            Blue[(long)CodeSize + 0xf8] = (uchar)iVar9;
            iVar9 = getc(__stream);
            *(char *)((long)&i_2 + (long)CodeSize) = (char)iVar9;
          }
        }
        else {
          (*Fl::warning)("%s does not have a colormap.",infname);
          for (iStack_360 = 0; iStack_360 < local_50; iStack_360 = iStack_360 + 1) {
            uVar2 = (uchar)((iStack_360 * 0xff) / (local_50 + -1));
            *(uchar *)((long)&i_2 + (long)iStack_360) = uVar2;
            Blue[(long)iStack_360 + 0xf8] = uVar2;
            Green[(long)iStack_360 + 0xf8] = uVar2;
          }
        }
        do {
          uVar7 = getc(__stream);
          uVar7 = uVar7 & 0xff;
          if (uVar7 == 0x21) {
            iVar9 = getc(__stream);
            bVar6 = (byte)iVar9;
            uVar7 = getc(__stream);
            n = uVar7 & 0xff;
            if ((bVar6 == 0xf9) && (n == 4)) {
              uVar7 = getc(__stream);
              getc(__stream);
              getc(__stream);
              iVar9 = getc(__stream);
              Red[0xff] = (uchar)iVar9;
              if ((uVar7 & 1) != 0) {
                bVar3 = true;
              }
              uVar7 = getc(__stream);
              n = uVar7 & 0xff;
            }
            else if ((bVar6 != 0xff) && (bVar6 != 0xfe)) {
              (*Fl::warning)("%s: unknown gif extension 0x%02x.",infname,(ulong)bVar6);
            }
          }
          else {
            if (uVar7 == 0x2c) goto code_r0x0027a3dd;
            (*Fl::warning)("%s: unknown gif code 0x%02x",infname,(ulong)uVar7);
            n = 0;
          }
          while (n != 0) {
            while (n != 0) {
              getc(__stream);
              n = n + -1;
            }
            uVar7 = getc(__stream);
            n = uVar7 & 0xff;
          }
        } while( true );
      }
      fclose(__stream);
      (*Fl::error)("Fl_GIF_Image: %s is not a GIF file.\n",infname);
      Fl_Image::ld((Fl_Image *)this,-3);
    }
  }
  return;
code_r0x0027a3dd:
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  uVar7 = getc(__stream);
  uVar10 = getc(__stream);
  uVar7 = (uVar7 & 0xff) + (uVar10 & 0xff) * 0x100;
  uVar10 = getc(__stream);
  uVar11 = getc(__stream);
  uVar10 = (uVar10 & 0xff) + (uVar11 & 0xff) * 0x100;
  uVar11 = getc(__stream);
  if ((uVar11 & 0x80) != 0) {
    for (iStack_36c = 0; iStack_36c < 2 << ((byte)uVar11 & 7); iStack_36c = iStack_36c + 1) {
      iVar9 = getc(__stream);
      Green[(long)iStack_36c + 0xf8] = (uchar)iVar9;
      iVar9 = getc(__stream);
      Blue[(long)iStack_36c + 0xf8] = (uchar)iVar9;
      iVar9 = getc(__stream);
      *(char *)((long)&i_2 + (long)iStack_36c) = (char)iVar9;
    }
  }
  uVar12 = getc(__stream);
  uVar13 = (uVar12 & 0xff) + 1;
  if (uVar13 <= uVar8) {
    local_50 = 1 << ((byte)uVar12 & 0x1f);
  }
  puVar16 = (uchar *)operator_new__((long)(int)(uVar7 * uVar10));
  p._4_4_ = 0;
  p._0_4_ = 0;
  _ClearCode = puVar16 + (int)uVar7;
  i_3._0_1_ = (byte)uVar13;
  bVar6 = (byte)i_3;
  uVar12 = 1 << ((byte)i_3 - 1 & 0x1f);
  FreeCode = 0;
  OldCode = (1 << ((byte)i_3 & 0x1f)) + -1;
  uVar8 = getc(__stream);
  iVar9 = getc(__stream);
  CurCode._3_1_ = (byte)iVar9;
  frombit = (uVar8 & 0xff) - 1;
  local_33c4 = 0;
  uVar8 = uVar12;
  iVar9 = uVar12 + 2;
  eol = puVar16;
  i_3 = uVar13;
  do {
    while( true ) {
      Prefix._8188_4_ = iVar9;
      Prefix._8184_4_ = uVar8;
      local_33c8 = (uint)CurCode._3_1_;
      if (7 < local_33c4 + i_3) {
        if (frombit < 1) {
          uVar8 = getc(__stream);
          frombit = uVar8 & 0xff;
          if (frombit == 0) goto LAB_0027accb;
        }
        uVar8 = getc(__stream);
        CurCode._3_1_ = (byte)uVar8;
        frombit = frombit + -1;
        local_33c8 = (uVar8 & 0xff) << 8 | local_33c8;
      }
      if (0xf < local_33c4 + i_3) {
        if (frombit < 1) {
          uVar8 = getc(__stream);
          frombit = uVar8 & 0xff;
          if (frombit == 0) goto LAB_0027accb;
        }
        uVar8 = getc(__stream);
        CurCode._3_1_ = (byte)uVar8;
        frombit = frombit + -1;
        local_33c8 = (uVar8 & 0xff) << 0x10 | local_33c8;
      }
      uVar8 = (int)local_33c8 >> ((byte)local_33c4 & 0x1f) & OldCode;
      local_33c4 = (local_33c4 + i_3) % 8;
      if (uVar8 != uVar12) break;
      OldCode = (1 << (bVar6 & 0x1f)) + -1;
      uVar8 = uVar12;
      iVar9 = uVar12 + 2;
      i_3 = uVar13;
    }
    if (uVar8 == uVar12 + 1) goto LAB_0027accb;
    ppuStack_37e0 = &tp;
    used._252_4_ = uVar8;
    if ((int)Prefix._8188_4_ <= (int)uVar8) {
      if (uVar8 != Prefix._8188_4_) {
        (*Fl::error)("Fl_GIF_Image: %s - LZW Barf!",infname);
LAB_0027accb:
        Fl_Image::w((Fl_Image *)this,uVar7);
        Fl_Image::h((Fl_Image *)this,uVar10);
        Fl_Image::d((Fl_Image *)this,1);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(int)(uVar10 + 2);
        uVar17 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar17 = 0xffffffffffffffff;
        }
        p_00 = (char **)operator_new__(uVar17);
        uVar5 = Green[0xf8];
        uVar2 = Blue[0xf8];
        uVar4 = (undefined1)i_2;
        if ((bVar3) && (Red[0xff] != '\0')) {
          eol = puVar16 + (int)(uVar7 * uVar10);
          while (puVar20 = eol + -1, puVar16 < eol) {
            eol = puVar20;
            if (*puVar20 == Red[0xff]) {
              *puVar20 = '\0';
            }
            else if (*puVar20 == '\0') {
              *puVar20 = Red[0xff];
            }
          }
          Green[0xf8] = Green[(ulong)Red[0xff] + 0xf8];
          Green[(ulong)Red[0xff] + 0xf8] = uVar5;
          Blue[0xf8] = Blue[(ulong)Red[0xff] + 0xf8];
          Blue[(ulong)Red[0xff] + 0xf8] = uVar2;
          i_2._0_1_ = *(undefined1 *)((long)&i_2 + (ulong)Red[0xff]);
          *(undefined1 *)((long)&i_2 + (ulong)Red[0xff]) = uVar4;
        }
        for (numcolors = 0; numcolors < local_50; numcolors = numcolors + 1) {
          remap[(long)numcolors + 0xf8] = '\0';
        }
        eol = puVar16 + (int)(uVar7 * uVar10);
        while (puVar16 < eol) {
          remap[(ulong)eol[-1] + 0xf8] = '\x01';
          eol = eol + -1;
        }
        length = 0x21;
        if (bVar3 && remap[0xf8] != '\0') {
          length = 0x20;
        }
        local_39f4 = 0;
        for (numcolors = 0; numcolors < local_50; numcolors = numcolors + 1) {
          if (remap[(long)numcolors + 0xf8] != '\0') {
            *(char *)((long)&base + (long)numcolors) = (char)length;
            local_39f4 = local_39f4 + 1;
            length = length + 1;
          }
        }
        iVar9 = sprintf((char *)local_33b8,"%d %d %d %d",(ulong)uVar7,(ulong)uVar10,
                        (ulong)(uint)-local_39f4,1);
        pcVar18 = (char *)operator_new__((long)(iVar9 + 1));
        *p_00 = pcVar18;
        strcpy(*p_00,(char *)local_33b8);
        eol = (uchar *)operator_new__((long)(local_39f4 << 2));
        p_00[1] = (char *)eol;
        for (numcolors = 0; numcolors < local_50; numcolors = numcolors + 1) {
          if (remap[(long)numcolors + 0xf8] != '\0') {
            *eol = *(uchar *)((long)&base + (long)numcolors);
            eol[1] = Green[(long)numcolors + 0xf8];
            puVar20 = eol + 3;
            eol[2] = Blue[(long)numcolors + 0xf8];
            eol = eol + 4;
            *puVar20 = *(uchar *)((long)&i_2 + (long)numcolors);
          }
        }
        eol = puVar16 + (int)(uVar7 * uVar10);
        while (pbVar21 = eol + -1, puVar16 < eol) {
          *pbVar21 = *(byte *)((long)&base + (ulong)*pbVar21);
          eol = pbVar21;
        }
        for (numcolors = 0; numcolors < (int)uVar10; numcolors = numcolors + 1) {
          pcVar18 = (char *)operator_new__((long)(int)(uVar7 + 1));
          p_00[numcolors + 2] = pcVar18;
          memcpy(p_00[numcolors + 2],puVar16 + (int)(numcolors * uVar7),(long)(int)uVar7);
          p_00[numcolors + 2][(int)uVar7] = '\0';
        }
        Fl_Image::data((Fl_Image *)this,p_00,uVar10 + 2);
        (this->super_Fl_Pixmap).alloc_data = 1;
        if (puVar16 != (uchar *)0x0) {
          operator_delete__(puVar16);
        }
        fclose(__stream);
        return;
      }
      ppuStack_37e0 = (uchar **)((long)&tp + 1);
      tp._0_1_ = (char)FreeCode;
      used._252_4_ = Prefix._8184_4_;
    }
    for (; local_50 <= (int)used._252_4_; used._252_4_ = (int)Prefix[(long)(int)used._252_4_ + -4])
    {
      *(uchar *)ppuStack_37e0 = local_33b8[(int)used._252_4_];
      ppuStack_37e0 = (uchar **)((long)ppuStack_37e0 + 1);
    }
    FreeCode._0_1_ = used[0xfc];
    FreeCode._1_1_ = used[0xfd];
    FreeCode._2_1_ = used[0xfe];
    FreeCode._3_1_ = used[0xff];
    *(uchar *)ppuStack_37e0 = (uchar)used._252_4_;
    ppuStack_37e0 = (uchar **)((long)ppuStack_37e0 + 1);
    do {
      ppuVar19 = (uchar **)((long)ppuStack_37e0 + -1);
      puVar20 = eol + 1;
      *eol = *(uchar *)((long)ppuStack_37e0 + -1);
      eol = puVar20;
      if (_ClearCode <= puVar20) {
        if ((uVar11 & 0x40) == 0) {
          p._4_4_ = p._4_4_ + 1;
        }
        else {
          switch((int)p) {
          case 0:
            p._4_4_ = p._4_4_ + 8;
            if ((int)uVar10 <= p._4_4_) {
              p._0_4_ = (int)p + 1;
              p._4_4_ = 4;
            }
            break;
          case 1:
            p._4_4_ = p._4_4_ + 8;
            if ((int)uVar10 <= p._4_4_) {
              p._0_4_ = (int)p + 1;
              p._4_4_ = 2;
            }
            break;
          case 2:
            p._4_4_ = p._4_4_ + 4;
            if ((int)uVar10 <= p._4_4_) {
              p._0_4_ = (int)p + 1;
              p._4_4_ = 1;
            }
            break;
          case 3:
            p._4_4_ = p._4_4_ + 2;
          }
        }
        if ((int)uVar10 <= p._4_4_) {
          p._4_4_ = 0;
        }
        eol = puVar16 + (int)(p._4_4_ * uVar7);
        _ClearCode = eol + (int)uVar7;
      }
      ppuStack_37e0 = ppuVar19;
    } while (&tp < ppuVar19);
    iVar9 = Prefix._8188_4_;
    if (Prefix._8184_4_ != uVar12) {
      Prefix[(long)(int)Prefix._8188_4_ + -4] = (short)Prefix._8184_4_;
      local_33b8[(int)Prefix._8188_4_] = (uchar)used._252_4_;
      iVar14 = Prefix._8188_4_ + 1;
      iVar9 = iVar14;
      if ((OldCode < iVar14) && (iVar9 = Prefix._8188_4_, i_3 < 0xc)) {
        i_3 = i_3 + 1;
        OldCode = (1 << ((byte)i_3 & 0x1f)) + -1;
        iVar9 = iVar14;
      }
    }
  } while( true );
}

Assistant:

Fl_GIF_Image::Fl_GIF_Image(const char *infname) : Fl_Pixmap((char *const*)0) {
  FILE *GifFile;	// File to read
  char **new_data;	// Data array

  if ((GifFile = fl_fopen(infname, "rb")) == NULL) {
    Fl::error("Fl_GIF_Image: Unable to open %s!", infname);
    ld(ERR_FILE_ACCESS);
    return;
  }

  {char b[6];
  if (fread(b,1,6,GifFile)<6) {
    fclose(GifFile);
    ld(ERR_FILE_ACCESS);
    return; /* quit on eof */
  }
  if (b[0]!='G' || b[1]!='I' || b[2] != 'F') {
    fclose(GifFile);
    Fl::error("Fl_GIF_Image: %s is not a GIF file.\n", infname);
    ld(ERR_FORMAT);
    return;
  }
  if (b[3]!='8' || b[4]>'9' || b[5]!= 'a')
    Fl::warning("%s is version %c%c%c.",infname,b[3],b[4],b[5]);
  }

  int Width; GETSHORT(Width);
  int Height; GETSHORT(Height);

  uchar ch = NEXTBYTE;
  char HasColormap = ((ch & 0x80) != 0);
  int BitsPerPixel = (ch & 7) + 1;
  int ColorMapSize = 1 << BitsPerPixel;
  // int OriginalResolution = ((ch>>4)&7)+1;
  // int SortedTable = (ch&8)!=0;
  ch = NEXTBYTE; // Background Color index
  ch = NEXTBYTE; // Aspect ratio is N/64

  // Read in global colormap:
  uchar transparent_pixel = 0;
  char has_transparent = 0;
  uchar Red[256], Green[256], Blue[256]; /* color map */
  if (HasColormap) {
    for (int i=0; i < ColorMapSize; i++) {	
      Red[i] = NEXTBYTE;
      Green[i] = NEXTBYTE;
      Blue[i] = NEXTBYTE;
    }
  } else {
    Fl::warning("%s does not have a colormap.", infname);
    for (int i = 0; i < ColorMapSize; i++)
      Red[i] = Green[i] = Blue[i] = (uchar)(255 * i / (ColorMapSize-1));
  }

  int CodeSize;		/* Code size, init from GIF header, increases... */
  char Interlace;

  for (;;) {

    int i = NEXTBYTE;
    if (i<0) {
      fclose(GifFile);
      Fl::error("Fl_GIF_Image: %s - unexpected EOF",infname); 
      w(0); h(0); d(0); ld(ERR_FORMAT);
      return;
    }
    int blocklen;

    //  if (i == 0x3B) return 0;  eof code

    if (i == 0x21) {		// a "gif extension"

      ch = NEXTBYTE;
      blocklen = NEXTBYTE;

      if (ch==0xF9 && blocklen==4) { // Netscape animation extension

	char bits;
	bits = NEXTBYTE;
	getc(GifFile); getc(GifFile); // GETSHORT(delay);
	transparent_pixel = NEXTBYTE;
	if (bits & 1) has_transparent = 1;
	blocklen = NEXTBYTE;

      } else if (ch == 0xFF) { // Netscape repeat count
	;

      } else if (ch != 0xFE) { //Gif Comment
	Fl::warning("%s: unknown gif extension 0x%02x.", infname, ch);
      }
    } else if (i == 0x2c) {	// an image

      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(x_position);
      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(y_position);
      GETSHORT(Width);
      GETSHORT(Height);
      ch = NEXTBYTE;
      Interlace = ((ch & 0x40) != 0);
      if (ch&0x80) { 
	// read local color map
	int n = 2<<(ch&7);
	for (i=0; i < n; i++) {	
	  Red[i] = NEXTBYTE;
	  Green[i] = NEXTBYTE;
	  Blue[i] = NEXTBYTE;
	}
      }
      CodeSize = NEXTBYTE+1;
      break; // okay, this is the image we want
    } else {
      Fl::warning("%s: unknown gif code 0x%02x", infname, i);
      blocklen = 0;
    }

    // skip the data:
    while (blocklen>0) {while (blocklen--) {ch = NEXTBYTE;} blocklen=NEXTBYTE;}
  }

  if (BitsPerPixel >= CodeSize)
  {
    // Workaround for broken GIF files...
    BitsPerPixel = CodeSize - 1;
    ColorMapSize = 1 << BitsPerPixel;
  }

  uchar *Image = new uchar[Width*Height];

  int YC = 0, Pass = 0; /* Used to de-interlace the picture */
  uchar *p = Image;
  uchar *eol = p+Width;

  int InitCodeSize = CodeSize;
  int ClearCode = (1 << (CodeSize-1));
  int EOFCode = ClearCode + 1;
  int FirstFree = ClearCode + 2;
  int FinChar = 0;
  int ReadMask = (1<<CodeSize) - 1;
  int FreeCode = FirstFree;
  int OldCode = ClearCode;

  // tables used by LZW decompresser:
  short int Prefix[4096];
  uchar Suffix[4096];

  int blocklen = NEXTBYTE;
  uchar thisbyte = NEXTBYTE; blocklen--;
  int frombit = 0;

  for (;;) {

/* Fetch the next code from the raster data stream.  The codes can be
 * any length from 3 to 12 bits, packed into 8-bit bytes, so we have to
 * maintain our location as a pointer and a bit offset.
 * In addition, gif adds totally useless and annoying block counts
 * that must be correctly skipped over. */
    int CurCode = thisbyte;
    if (frombit+CodeSize > 7) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<8;
    }
    if (frombit+CodeSize > 15) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<16;
    }
    CurCode = (CurCode>>frombit)&ReadMask;
    frombit = (frombit+CodeSize)%8;

    if (CurCode == ClearCode) {
      CodeSize = InitCodeSize;
      ReadMask = (1<<CodeSize) - 1;
      FreeCode = FirstFree;
      OldCode = ClearCode;
      continue;
    }

    if (CurCode == EOFCode) break;

    uchar OutCode[1025]; // temporary array for reversing codes
    uchar *tp = OutCode;
    int i;
    if (CurCode < FreeCode) i = CurCode;
    else if (CurCode == FreeCode) {*tp++ = (uchar)FinChar; i = OldCode;}
    else {Fl::error("Fl_GIF_Image: %s - LZW Barf!", infname); break;}

    while (i >= ColorMapSize) {*tp++ = Suffix[i]; i = Prefix[i];}
    *tp++ = FinChar = i;
    do {
      *p++ = *--tp;
      if (p >= eol) {
	if (!Interlace) YC++;
	else switch (Pass) {
	case 0: YC += 8; if (YC >= Height) {Pass++; YC = 4;} break;
	case 1: YC += 8; if (YC >= Height) {Pass++; YC = 2;} break;
	case 2: YC += 4; if (YC >= Height) {Pass++; YC = 1;} break;
	case 3: YC += 2; break;
	}
	if (YC>=Height) YC=0; /* cheap bug fix when excess data */
	p = Image + YC*Width;
	eol = p+Width;
      }
    } while (tp > OutCode);

    if (OldCode != ClearCode) {
      Prefix[FreeCode] = (short)OldCode;
      Suffix[FreeCode] = FinChar;
      FreeCode++;
      if (FreeCode > ReadMask) {
	if (CodeSize < 12) {
	  CodeSize++;
	  ReadMask = (1 << CodeSize) - 1;
	}
	else FreeCode--;
      }
    }
    OldCode = CurCode;
  }

  // We are done reading the file, now convert to xpm:

  // allocate line pointer arrays:
  w(Width);
  h(Height);
  d(1);
  new_data = new char*[Height+2];

  // transparent pixel must be zero, swap if it isn't:
  if (has_transparent && transparent_pixel != 0) {
    // swap transparent pixel with zero
    p = Image+Width*Height;
    while (p-- > Image) {
      if (*p==transparent_pixel) *p = 0;
      else if (!*p) *p = transparent_pixel;
    }
    uchar t;
    t                        = Red[0];
    Red[0]                   = Red[transparent_pixel];
    Red[transparent_pixel]   = t;

    t                        = Green[0];
    Green[0]                 = Green[transparent_pixel];
    Green[transparent_pixel] = t;

    t                        = Blue[0];
    Blue[0]                  = Blue[transparent_pixel];
    Blue[transparent_pixel]  = t;
  }

  // find out what colors are actually used:
  uchar used[256]; uchar remap[256];
  int i;
  for (i = 0; i < ColorMapSize; i++) used[i] = 0;
  p = Image+Width*Height;
  while (p-- > Image) used[*p] = 1;

  // remap them to start with printing characters:
  int base = has_transparent && used[0] ? ' ' : ' '+1;
  int numcolors = 0;
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    remap[i] = (uchar)(base++);
    numcolors++;
  }

  // write the first line of xpm data (use suffix as temp array):
  int length = sprintf((char*)(Suffix),
		       "%d %d %d %d",Width,Height,-numcolors,1);
  new_data[0] = new char[length+1];
  strcpy(new_data[0], (char*)Suffix);

  // write the colormap
  new_data[1] = (char*)(p = new uchar[4*numcolors]);
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    *p++ = remap[i];
    *p++ = Red[i];
    *p++ = Green[i];
    *p++ = Blue[i];
  }

  // remap the image data:
  p = Image+Width*Height;
  while (p-- > Image) *p = remap[*p];

  // split the image data into lines:
  for (i=0; i<Height; i++) {
    new_data[i+2] = new char[Width+1];
    memcpy(new_data[i + 2], (char*)(Image + i*Width), Width);
    new_data[i + 2][Width] = 0;
  }

  data((const char **)new_data, Height + 2);
  alloc_data = 1;

  delete[] Image;

  fclose(GifFile);
}